

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  lua_State *L_00;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *p;
  undefined4 extraout_var;
  char *e;
  char *pcVar7;
  ushort **ppuVar8;
  char *pcVar9;
  ulong uVar10;
  size_t lp;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  long local_22c0;
  size_t local_22b8;
  ulong local_22b0;
  lua_State *local_22a8;
  undefined8 local_22a0;
  char *local_2298;
  size_t local_2290;
  lua_Integer local_2288;
  size_t local_2280;
  MatchState local_2278;
  luaL_Buffer local_2050;
  undefined8 uVar6;
  ulong uVar11;
  
  pcVar5 = luaL_checklstring(L,1,&local_2280);
  p = luaL_checklstring(L,2,&local_22b8);
  iVar4 = lua_type(L,3);
  uVar6 = CONCAT44(extraout_var,iVar4);
  local_2288 = luaL_optinteger(L,4,local_2280 + 1);
  cVar1 = *p;
  if (3 < iVar4 - 3U) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  luaL_buffinit(L,&local_2050);
  if (cVar1 == '^') {
    p = p + 1;
    local_22b8 = local_22b8 - 1;
  }
  local_2278.matchdepth = 200;
  local_2278.src_end = pcVar5 + local_2280;
  local_2278.p_end = p + local_22b8;
  pcVar9 = (char *)0x0;
  local_22c0 = 0;
  local_22a8 = L;
  local_22a0 = uVar6;
  local_2298 = p;
  local_2278.src_init = pcVar5;
  local_2278.L = L;
  do {
    e = pcVar5;
    if (local_2288 <= local_22c0) break;
    local_2278.level = '\0';
    e = match(&local_2278,pcVar5,p);
    L_00 = local_2278.L;
    if (e == pcVar9 || e == (char *)0x0) {
      e = pcVar5;
      if (local_2278.src_end <= pcVar5) break;
      if (local_2050.size <= local_2050.n) {
        luaL_prepbuffsize(&local_2050,1);
      }
      e = pcVar5 + 1;
      local_2050.b[local_2050.n] = *pcVar5;
      local_2050.n = local_2050.n + 1;
    }
    else {
      local_22c0 = local_22c0 + 1;
      pcVar9 = e;
      if ((int)uVar6 == 5) {
        push_onecapture(&local_2278,0,pcVar5,e);
        lua_gettable(L_00,3);
      }
      else {
        if ((int)uVar6 != 6) {
          pcVar7 = lua_tolstring(local_2278.L,3,&local_22b0);
          uVar6 = local_22a0;
          p = local_2298;
          if (local_22b0 != 0) {
            local_2290 = (long)e - (long)pcVar5;
            uVar10 = 0;
            do {
              cVar3 = pcVar7[uVar10];
              if (cVar3 == '%') {
                uVar11 = uVar10 + 1;
                ppuVar8 = __ctype_b_loc();
                bVar2 = pcVar7[uVar10 + 1];
                if ((*(byte *)((long)*ppuVar8 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                  if (bVar2 != 0x25) {
                    luaL_error(L_00,"invalid use of \'%c\' in replacement string",0x25);
                  }
                  if (local_2050.size <= local_2050.n) {
                    luaL_prepbuffsize(&local_2050,1);
                  }
                  local_2050.b[local_2050.n] = pcVar7[uVar11];
                  local_2050.n = local_2050.n + 1;
                }
                else if (bVar2 == 0x30) {
                  luaL_addlstring(&local_2050,pcVar5,local_2290);
                }
                else {
                  push_onecapture(&local_2278,(char)bVar2 + -0x31,pcVar5,e);
                  luaL_tolstring(L_00,-1,(size_t *)0x0);
                  lua_rotate(L_00,-2,-1);
                  lua_settop(L_00,-2);
                  luaL_addvalue(&local_2050);
                }
              }
              else {
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                  cVar3 = pcVar7[uVar10];
                }
                local_2050.b[local_2050.n] = cVar3;
                uVar11 = uVar10;
                local_2050.n = local_2050.n + 1;
              }
              uVar10 = uVar11 + 1;
              uVar6 = local_22a0;
              p = local_2298;
            } while (uVar10 < local_22b0);
          }
          goto LAB_001173ce;
        }
        lua_pushvalue(local_2278.L,3);
        iVar4 = push_captures(&local_2278,pcVar5,e);
        lua_callk(L_00,iVar4,1,0,(lua_KFunction)0x0);
      }
      iVar4 = lua_toboolean(L_00,-1);
      if (iVar4 == 0) {
        lua_settop(L_00,-2);
        lua_pushlstring(L_00,pcVar5,(long)e - (long)pcVar5);
      }
      else {
        iVar4 = lua_isstring(L_00,-1);
        if (iVar4 == 0) {
          iVar4 = lua_type(L_00,-1);
          pcVar5 = lua_typename(L_00,iVar4);
          luaL_error(L_00,"invalid replacement value (a %s)",pcVar5);
        }
      }
      luaL_addvalue(&local_2050);
    }
LAB_001173ce:
    pcVar5 = e;
  } while (cVar1 != '^');
  luaL_addlstring(&local_2050,e,(long)local_2278.src_end - (long)e);
  luaL_pushresult(&local_2050);
  lua_pushinteger(local_22a8,local_22c0);
  return 2;
}

Assistant:

static int str_gsub(lua_State *L) {
    size_t srcl, lp;
    const char *src = luaL_checklstring(L, 1, &srcl);  /* subject */
    const char *p = luaL_checklstring(L, 2, &lp);  /* pattern */
    const char *lastmatch = NULL;  /* end of last match */
    int tr = lua_type(L, 3);  /* replacement type */
    lua_Integer max_s = luaL_optinteger(L, 4, srcl + 1);  /* max replacements */
    int anchor = (*p == '^');
    lua_Integer n = 0;  /* replacement count */
    MatchState ms;
    luaL_Buffer b;
    luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                     tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                  "string/function/table expected");
    luaL_buffinit(L, &b);
    if (anchor) {
        p++;
        lp--;  /* skip anchor character */
    }
    prepstate(&ms, L, src, srcl, p, lp);
    while (n < max_s) {
        const char *e;
        reprepstate(&ms);  /* (re)prepare state for new match */
        if ((e = match(&ms, src, p)) != NULL && e != lastmatch) {  /* match? */
            n++;
            add_value(&ms, &b, src, e, tr);  /* add replacement to buffer */
            src = lastmatch = e;
        } else if (src < ms.src_end)  /* otherwise, skip one character */
            luaL_addchar(&b, *src++);
        else break;  /* end of subject */
        if (anchor) break;
    }
    luaL_addlstring(&b, src, ms.src_end - src);
    luaL_pushresult(&b);
    lua_pushinteger(L, n);  /* number of substitutions */
    return 2;
}